

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<cv::Rect_<int>_> *this;
  char *__s;
  double dVar1;
  double dVar2;
  double dVar3;
  byte bVar4;
  int iVar5;
  ostream *this_00;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  size_type sVar9;
  double dVar10;
  double dVar11;
  pointer *in_R8;
  undefined1 *in_stack_fffffffffffff5f8;
  reference local_9d0;
  vector<int,_std::allocator<int>_> local_918;
  _InputArray local_900;
  allocator<char> local_8e1;
  string local_8e0 [32];
  _InputArray local_8c0;
  allocator<char> local_8a1;
  string local_8a0 [32];
  Rect_<int> local_880;
  _InputOutputArray local_870;
  Point_<int> local_858;
  _InputOutputArray local_850;
  undefined1 local_838 [8];
  Rect box;
  Point boxStart;
  Size boxSize;
  Point centerPoint;
  Scalar color;
  BoxPoint point;
  size_t i_1;
  undefined1 local_7b0 [8];
  vector<BoxPoint,_std::allocator<BoxPoint>_> predictedTrajectory;
  _InputArray local_790;
  allocator<char> local_771;
  string local_770 [32];
  Scalar_<double> local_750;
  Point_<int> local_730;
  _InputOutputArray local_728;
  Scalar_<double> local_710;
  Rect_<int> local_6f0;
  _InputOutputArray local_6e0;
  _InputArray local_6c8;
  undefined1 local_6b0 [8];
  Rect rect;
  ulong local_688;
  size_t i;
  undefined1 local_668 [8];
  vector<BoxPoint,_std::allocator<BoxPoint>_> centers;
  undefined1 local_648 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> boundingRect;
  _OutputArray local_628;
  _InputArray local_610;
  undefined1 local_5f8 [32];
  Point_<int> local_5d8;
  Mat local_5d0 [96];
  _InputArray local_570;
  _OutputArray local_558;
  _InputArray local_540;
  _OutputArray local_528;
  _InputArray local_510;
  _OutputArray local_4f8;
  _InputArray local_4e0;
  _InputArray local_4c8;
  Size_<int> local_4b0;
  _OutputArray local_4a8;
  _InputArray local_490;
  _InputArray local_478;
  _InputArray local_460;
  Mat local_448 [96];
  _OutputArray local_3e8;
  undefined1 local_3d0 [8];
  vector<BoxPoint,_std::allocator<BoxPoint>_> initialTrajectory;
  _OutputArray local_3b0;
  _InputArray local_398;
  _InputArray local_380;
  _InputArray local_368;
  Mat local_350 [96];
  _OutputArray local_2f0;
  undefined1 local_2d8 [8];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  Mat lastFrame;
  Mat local_260 [8];
  Mat thresh;
  Mat local_200 [8];
  Mat frameDelta;
  Mat local_1a0 [8];
  Mat grayFrame;
  Mat local_140 [8];
  Mat frame;
  Mat local_e0 [8];
  Mat firstFrame;
  undefined1 local_80 [8];
  VideoCapture vid;
  int minContourArea;
  allocator<char> local_39;
  string local_38 [8];
  string videoFile;
  char **argv_local;
  int argc_local;
  
  videoFile.field_2._8_8_ = argv;
  if (argc < 2) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Requires 1 Argument");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
    std::allocator<char>::~allocator(&local_39);
    cv::VideoCapture::VideoCapture((VideoCapture *)local_80,local_38,0);
    cv::Mat::Mat(local_e0);
    cv::Mat::Mat(local_140);
    cv::Mat::Mat(local_1a0);
    cv::Mat::Mat(local_200);
    cv::Mat::Mat(local_260);
    cv::Mat::Mat((Mat *)&contours.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              *)local_2d8);
    cv::_OutputArray::_OutputArray(&local_2f0,local_140);
    cv::VideoCapture::read((_OutputArray *)local_80);
    cv::_OutputArray::~_OutputArray(&local_2f0);
    cv::Mat::clone();
    cv::Mat::operator=((Mat *)&contours.
                               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_350);
    cv::Mat::~Mat(local_350);
    cv::_InputArray::_InputArray(&local_368,local_140);
    cv::_OutputArray::_OutputArray((_OutputArray *)&local_380,local_e0);
    cv::cvtColor((cv *)&local_368,&local_380,(_OutputArray *)0x6,0,(int)in_R8);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&local_380);
    cv::_InputArray::~_InputArray(&local_368);
    cv::_InputArray::_InputArray(&local_398,local_e0);
    cv::_OutputArray::_OutputArray(&local_3b0,local_e0);
    cv::Size_<int>::Size_
              ((Size_<int> *)
               &initialTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x15,0x15);
    cv::GaussianBlur(0,&local_398,&local_3b0,
                     &initialTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::~_OutputArray(&local_3b0);
    cv::_InputArray::~_InputArray(&local_398);
    std::vector<BoxPoint,_std::allocator<BoxPoint>_>::vector
              ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_3d0);
    do {
      iVar5 = (int)in_R8;
      cv::_OutputArray::_OutputArray(&local_3e8,local_140);
      bVar4 = cv::VideoCapture::read((_OutputArray *)local_80);
      cv::_OutputArray::~_OutputArray(&local_3e8);
      if ((bVar4 & 1) == 0) break;
      cv::Mat::clone();
      cv::Mat::operator=((Mat *)&contours.
                                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,local_448);
      cv::Mat::~Mat(local_448);
      cv::_InputArray::_InputArray(&local_460,local_140);
      cv::_OutputArray::_OutputArray((_OutputArray *)&local_478,local_1a0);
      cv::cvtColor((cv *)&local_460,&local_478,(_OutputArray *)0x6,0,iVar5);
      cv::_OutputArray::~_OutputArray((_OutputArray *)&local_478);
      cv::_InputArray::~_InputArray(&local_460);
      cv::_InputArray::_InputArray(&local_490,local_1a0);
      cv::_OutputArray::_OutputArray(&local_4a8,local_1a0);
      cv::Size_<int>::Size_(&local_4b0,0x15,0x15);
      cv::GaussianBlur(0,&local_490,&local_4a8,&local_4b0,4);
      cv::_OutputArray::~_OutputArray(&local_4a8);
      cv::_InputArray::~_InputArray(&local_490);
      cv::_InputArray::_InputArray(&local_4c8,local_e0);
      cv::_InputArray::_InputArray(&local_4e0,local_1a0);
      cv::_OutputArray::_OutputArray(&local_4f8,local_200);
      cv::absdiff(&local_4c8,&local_4e0,&local_4f8);
      cv::_OutputArray::~_OutputArray(&local_4f8);
      cv::_InputArray::~_InputArray(&local_4e0);
      cv::_InputArray::~_InputArray(&local_4c8);
      cv::_InputArray::_InputArray(&local_510,local_200);
      cv::_OutputArray::_OutputArray(&local_528,local_260);
      cv::threshold(&local_510,&local_528,25.0,255.0,0);
      cv::_OutputArray::~_OutputArray(&local_528);
      cv::_InputArray::~_InputArray(&local_510);
      cv::_InputArray::_InputArray(&local_540,local_260);
      cv::_OutputArray::_OutputArray(&local_558,local_260);
      cv::Mat::Mat(local_5d0);
      cv::_InputArray::_InputArray(&local_570,local_5d0);
      cv::Point_<int>::Point_(&local_5d8,-1,-1);
      cv::morphologyDefaultBorderValue();
      in_stack_fffffffffffff5f8 = local_5f8;
      cv::dilate(&local_540,&local_558,&local_570,&local_5d8,2,0,in_stack_fffffffffffff5f8);
      cv::_InputArray::~_InputArray(&local_570);
      cv::Mat::~Mat(local_5d0);
      cv::_OutputArray::~_OutputArray(&local_558);
      cv::_InputArray::~_InputArray(&local_540);
      cv::_InputArray::_InputArray(&local_610,local_260);
      cv::_OutputArray::_OutputArray<cv::Point_<int>>
                (&local_628,
                 (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  *)local_2d8);
      cv::Point_<int>::Point_
                ((Point_<int> *)
                 &boundingRect.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      in_R8 = &boundingRect.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      cv::findContours(&local_610,&local_628,0,2);
      cv::_OutputArray::~_OutputArray(&local_628);
      cv::_InputArray::~_InputArray(&local_610);
      sVar8 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      *)local_2d8);
      this = (allocator<cv::Rect_<int>_> *)
             ((long)&centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<cv::Rect_<int>_>::allocator(this);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_648,sVar8,this);
      std::allocator<cv::Rect_<int>_>::~allocator
                ((allocator<cv::Rect_<int>_> *)
                 ((long)&centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                *)&i,(vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      *)local_2d8);
      getCenters((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_668,
                 (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  *)&i);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 *)&i);
      sVar8 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::size
                        ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_668);
      if (sVar8 != 0) {
        pvVar6 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at
                           ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_668,0);
        std::vector<BoxPoint,std::allocator<BoxPoint>>::emplace_back<BoxPoint&>
                  ((vector<BoxPoint,std::allocator<BoxPoint>> *)local_3d0,pvVar6);
      }
      for (local_688 = 0;
          sVar8 = std::
                  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                          *)local_2d8), local_688 < sVar8; local_688 = local_688 + 1) {
        pvVar7 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::at((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       *)local_2d8,local_688);
        cv::_InputArray::_InputArray<cv::Point_<int>>((_InputArray *)&rect.width,pvVar7);
        dVar10 = (double)cv::contourArea((_InputArray *)&rect.width,false);
        cv::_InputArray::~_InputArray((_InputArray *)&rect.width);
        if (300.0 <= dVar10) {
          pvVar7 = std::
                   vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   ::at((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         *)local_2d8,local_688);
          cv::_InputArray::_InputArray<cv::Point_<int>>(&local_6c8,pvVar7);
          cv::boundingRect((_InputArray *)local_6b0);
          cv::_InputArray::~_InputArray(&local_6c8);
          cv::_InputOutputArray::_InputOutputArray(&local_6e0,local_140);
          cv::Rect_<int>::Rect_(&local_6f0,(Rect_<int> *)local_6b0);
          cv::Scalar_<double>::Scalar_(&local_710,0.0,0.0,255.0,0.0);
          cv::rectangle(&local_6e0,&local_6f0,&local_710,1,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_6e0);
          cv::_InputOutputArray::_InputOutputArray(&local_728,local_140);
          pvVar6 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at
                             ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_668,local_688);
          dVar10 = pvVar6->x;
          pvVar6 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at
                             ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_668,local_688);
          cv::Point_<int>::Point_(&local_730,(int)dVar10,(int)pvVar6->z);
          cv::Scalar_<double>::Scalar_(&local_750,0.0,0.0,255.0,0.0);
          in_stack_fffffffffffff5f8 =
               (undefined1 *)((ulong)in_stack_fffffffffffff5f8 & 0xffffffff00000000);
          in_R8 = (pointer *)0x1;
          cv::circle(&local_728,&local_730,2,&local_750,1,8,in_stack_fffffffffffff5f8);
          cv::_InputOutputArray::~_InputOutputArray(&local_728);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_770,"Camera",&local_771);
      cv::_InputArray::_InputArray(&local_790,local_140);
      cv::imshow(local_770,&local_790);
      cv::_InputArray::~_InputArray(&local_790);
      std::__cxx11::string::~string(local_770);
      std::allocator<char>::~allocator(&local_771);
      cv::waitKey(0);
      iVar5 = cv::waitKey(1);
      if (iVar5 == 0x1b) {
        predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
      }
      else {
        predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      std::vector<BoxPoint,_std::allocator<BoxPoint>_>::~vector
                ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_668);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_648);
    } while (predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ == 0);
    std::vector<BoxPoint,_std::allocator<BoxPoint>_>::vector
              ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)&i_1,
               (vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_3d0);
    getPredictedTrajectory
              ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_7b0,
               (vector<BoxPoint,_std::allocator<BoxPoint>_> *)&i_1,25.0,0.5);
    std::vector<BoxPoint,_std::allocator<BoxPoint>_>::~vector
              ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)&i_1);
    point.z = 0.0;
    while( true ) {
      sVar8 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::size
                        ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_3d0);
      sVar9 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::size
                        ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_7b0);
      if (sVar8 + sVar9 <= (ulong)point.z) break;
      dVar10 = (double)std::vector<BoxPoint,_std::allocator<BoxPoint>_>::size
                                 ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_3d0);
      if ((ulong)point.z < (ulong)dVar10) {
        local_9d0 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at
                              ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_3d0,
                               (size_type)point.z);
      }
      else {
        sVar8 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::size
                          ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_3d0);
        local_9d0 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at
                              ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_7b0,
                               (long)point.z - sVar8);
      }
      dVar10 = local_9d0->x;
      dVar1 = local_9d0->yHeight;
      dVar2 = local_9d0->yWidth;
      dVar3 = local_9d0->z;
      dVar11 = (double)std::vector<BoxPoint,_std::allocator<BoxPoint>_>::size
                                 ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_3d0);
      if ((ulong)point.z < (ulong)dVar11) {
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)&centerPoint,0.0,0.0,255.0,0.0);
      }
      else {
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)&centerPoint,255.0,0.0,0.0,0.0);
      }
      cv::Point_<int>::Point_((Point_<int> *)&boxSize,(int)dVar10,-(int)dVar3);
      cv::Size_<int>::Size_((Size_<int> *)&boxStart,(int)dVar1,(int)dVar2);
      cv::Point_<int>::Point_
                ((Point_<int> *)&box.width,boxSize.width - (int)((double)boxStart.x * 0.5),
                 boxSize.height - (int)((double)boxStart.y * 0.5));
      cv::Rect_<int>::Rect_
                ((Rect_<int> *)local_838,(Point_<int> *)&box.width,(Size_<int> *)&boxStart);
      cv::_InputOutputArray::_InputOutputArray
                (&local_850,
                 (Mat *)&contours.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::Point_<int>::Point_(&local_858,(Point_<int> *)&boxSize);
      in_stack_fffffffffffff5f8 =
           (undefined1 *)((ulong)in_stack_fffffffffffff5f8 & 0xffffffff00000000);
      cv::circle(&local_850,&local_858,2,&centerPoint,1,8,in_stack_fffffffffffff5f8);
      cv::_InputOutputArray::~_InputOutputArray(&local_850);
      cv::_InputOutputArray::_InputOutputArray
                (&local_870,
                 (Mat *)&contours.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::Rect_<int>::Rect_(&local_880,(Rect_<int> *)local_838);
      cv::rectangle(&local_870,&local_880,&centerPoint,1,8,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_870);
      point.z = (double)((long)point.z + 1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_8a0,"Predicted",&local_8a1);
    cv::_InputArray::_InputArray
              (&local_8c0,
               (Mat *)&contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::imshow(local_8a0,&local_8c0);
    cv::_InputArray::~_InputArray(&local_8c0);
    std::__cxx11::string::~string(local_8a0);
    std::allocator<char>::~allocator(&local_8a1);
    cv::waitKey(0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_8e0,"output.jpg",&local_8e1);
    cv::_InputArray::_InputArray
              (&local_900,
               (Mat *)&contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_918);
    cv::imwrite(local_8e0,&local_900,(vector *)&local_918);
    std::vector<int,_std::allocator<int>_>::~vector(&local_918);
    cv::_InputArray::~_InputArray(&local_900);
    std::__cxx11::string::~string(local_8e0);
    std::allocator<char>::~allocator(&local_8e1);
    std::vector<BoxPoint,_std::allocator<BoxPoint>_>::~vector
              ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_7b0);
    std::vector<BoxPoint,_std::allocator<BoxPoint>_>::~vector
              ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)local_3d0);
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               *)local_2d8);
    cv::Mat::~Mat((Mat *)&contours.
                          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::Mat::~Mat(local_260);
    cv::Mat::~Mat(local_200);
    cv::Mat::~Mat(local_1a0);
    cv::Mat::~Mat(local_140);
    cv::Mat::~Mat(local_e0);
    cv::VideoCapture::~VideoCapture((VideoCapture *)local_80);
    std::__cxx11::string::~string(local_38);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){
    
    if(argc <= 1){
        std::cerr << "Requires 1 Argument" << std::endl;
    }else{
        std::string videoFile = argv[1];
    
        int minContourArea = 300;
        cv::VideoCapture vid = cv::VideoCapture(videoFile);
        cv::Mat firstFrame, frame, grayFrame, frameDelta, thresh, lastFrame;
        std::vector<std::vector<cv::Point>> contours;
        vid.read(frame);
        lastFrame = frame.clone();
        cv::cvtColor(frame, firstFrame, cv::COLOR_BGR2GRAY);
        cv::GaussianBlur(firstFrame, firstFrame, cv::Size(21, 21), 0);


        std::vector<BoxPoint> initialTrajectory;
        
        while(vid.read(frame)){
            lastFrame = frame.clone();
            cv::cvtColor(frame, grayFrame, cv::COLOR_BGR2GRAY); 
            cv::GaussianBlur(grayFrame, grayFrame, cv::Size(21, 21), 0);
            cv::absdiff(firstFrame, grayFrame, frameDelta);
            cv::threshold(frameDelta, thresh, 25, 255, cv::THRESH_BINARY);
            cv::dilate(thresh, thresh, cv::Mat(), cv::Point(-1, -1), 2);
            cv::findContours(thresh, contours, cv::RETR_EXTERNAL, cv::CHAIN_APPROX_SIMPLE);
            
            std::vector<cv::Rect> boundingRect{contours.size()};
            std::vector<BoxPoint> centers = getCenters(contours);
            if(centers.size() > 0){
                initialTrajectory.emplace_back(centers.at(0));
            };
            
            for(size_t i=0; i<contours.size(); i++){
                if(cv::contourArea(contours.at(i)) < minContourArea){ continue; }
          
                cv::Rect rect = cv::boundingRect(contours.at(i));
                cv::rectangle(frame, rect, cv::Scalar(0, 0, 255), 1);

                cv::circle(frame, cv::Point{(int) centers.at(i).x, (int) centers.at(i).z}, 2, cv::Scalar(0, 0, 255));
            }
            
            cv::imshow("Camera", frame);
            cv::waitKey(0);
            if(cv::waitKey(1) == 27){
                break;
            }

        }

        std::vector<BoxPoint> predictedTrajectory = getPredictedTrajectory(initialTrajectory, 25.0, 0.50);
        for(size_t i=0; i<initialTrajectory.size()+predictedTrajectory.size(); i++){
            BoxPoint point = i < initialTrajectory.size() ? initialTrajectory.at(i) : predictedTrajectory.at(i-initialTrajectory.size());
            cv::Scalar color = i < initialTrajectory.size() ? cv::Scalar(0, 0, 255) : cv::Scalar(255, 0, 0);
                    
            cv::Point centerPoint{(int) point.x, -1 * (int) point.z};
            cv::Size boxSize = cv::Size{(int) point.yHeight, (int) point.yWidth};
            cv::Point boxStart{
                centerPoint.x - (int)(0.5*boxSize.width),
                centerPoint.y - (int)(0.5*boxSize.height)};
            cv::Rect box{boxStart, boxSize}; 

            cv::circle(lastFrame, centerPoint, 2, color);
            cv::rectangle(lastFrame, box, color);
        };
        cv::imshow("Predicted", lastFrame);
        cv::waitKey(0); 
        cv::imwrite("output.jpg", lastFrame);
    }
}